

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_counted_impl.hpp
# Opt level: O1

void * __thiscall
boost::detail::
sp_counted_impl_pd<PartialJPDPValuePair_*,_boost::detail::sp_ms_deleter<PartialJPDPValuePair>_>::
get_deleter(sp_counted_impl_pd<PartialJPDPValuePair_*,_boost::detail::sp_ms_deleter<PartialJPDPValuePair>_>
            *this,sp_typeinfo *ti)

{
  char *__s1;
  int iVar1;
  sp_ms_deleter<PartialJPDPValuePair> *psVar2;
  bool bVar3;
  
  __s1 = *(char **)(ti + 8);
  if (__s1 == "N5boost6detail13sp_ms_deleterI20PartialJPDPValuePairEE") {
    bVar3 = true;
  }
  else if (*__s1 == '*') {
    bVar3 = false;
  }
  else {
    iVar1 = strcmp(__s1,"N5boost6detail13sp_ms_deleterI20PartialJPDPValuePairEE");
    bVar3 = iVar1 == 0;
  }
  psVar2 = (sp_ms_deleter<PartialJPDPValuePair> *)0x0;
  if (bVar3) {
    psVar2 = &this->del;
  }
  return psVar2;
}

Assistant:

virtual void * get_deleter( detail::sp_typeinfo const & ti )
    {
        return ti == BOOST_SP_TYPEID(D)? &reinterpret_cast<char&>( del ): 0;
    }